

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShadedEx<ImPlot::GetterYs<float>,ImPlot::GetterYRef>
               (char *label_id,GetterYs<float> *getter1,GetterYRef *getter2,bool fit2)

{
  GetterYRef *getter2_00;
  GetterYRef *getter1_00;
  bool bVar1;
  ImPlotScale IVar2;
  TransformerLogLog local_144;
  ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog> local_140;
  TransformerLinLog local_10c;
  ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog> local_108;
  TransformerLogLin local_d4;
  ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin> local_d0;
  TransformerLinLin local_9c;
  ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin> local_98;
  ImU32 local_64;
  ImDrawList *pIStack_60;
  ImU32 col;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  int local_3c;
  undefined1 auStack_38 [4];
  int i_1;
  int local_28;
  byte local_21;
  int i;
  bool fit2_local;
  GetterYRef *getter2_local;
  GetterYs<float> *getter1_local;
  char *label_id_local;
  
  local_21 = fit2;
  _i = getter2;
  getter2_local = (GetterYRef *)getter1;
  getter1_local = (GetterYs<float> *)label_id;
  bVar1 = BeginItem(label_id,1);
  if (bVar1) {
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (local_28 = 0; local_28 < getter2_local->Count; local_28 = local_28 + 1) {
        _auStack_38 = GetterYs<float>::operator()((GetterYs<float> *)getter2_local,local_28);
        FitPoint((ImPlotPoint *)auStack_38);
      }
      if ((local_21 & 1) != 0) {
        for (local_3c = 0; local_3c < _i->Count; local_3c = local_3c + 1) {
          _s = GetterYRef::operator()(_i,local_3c);
          FitPoint((ImPlotPoint *)&s);
        }
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    pIStack_60 = GetPlotDrawList();
    if (((ulong)(DrawList->_TextureIdStack).Data & 0x10000000000) != 0) {
      local_64 = ImGui::GetColorU32((ImVec4 *)&DrawList->IdxBuffer);
      IVar2 = GetCurrentScale();
      getter1_00 = getter2_local;
      getter2_00 = _i;
      switch(IVar2) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_9c);
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
        ShadedRenderer(&local_98,(GetterYs<float> *)getter1_00,getter2_00,&local_9c,local_64);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>>
                  (&local_98,pIStack_60,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_d4);
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
        ShadedRenderer(&local_d0,(GetterYs<float> *)getter1_00,getter2_00,&local_d4,local_64);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>>
                  (&local_d0,pIStack_60,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog(&local_10c);
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>::
        ShadedRenderer(&local_108,(GetterYs<float> *)getter1_00,getter2_00,&local_10c,local_64);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>>
                  (&local_108,pIStack_60,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog(&local_144);
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
        ShadedRenderer(&local_140,(GetterYs<float> *)getter1_00,getter2_00,&local_144,local_64);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>>
                  (&local_140,pIStack_60,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}